

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O0

void print_pixel_type_list(vector<int,_std::allocator<int>_> *list)

{
  int iVar1;
  size_type sVar2;
  const_reference pvVar3;
  vector<int,_std::allocator<int>_> *in_RDI;
  int type;
  size_t i;
  ulong local_10;
  
  local_10 = 0;
  while( true ) {
    sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RDI);
    if (sVar2 <= local_10) break;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,local_10);
    iVar1 = *pvVar3;
    if (iVar1 == -0xe9) {
      fprintf(_stderr,"RAW");
    }
    if (iVar1 == 1) {
      fprintf(_stderr,"RGB");
    }
    if (iVar1 == 2) {
      fprintf(_stderr,"BGR");
    }
    if (iVar1 == 3) {
      fprintf(_stderr,"GRAY");
    }
    if (iVar1 == 4) {
      fprintf(_stderr,"RGBA");
    }
    if (iVar1 == 5) {
      fprintf(_stderr,"BGRA");
    }
    sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RDI);
    if (local_10 != sVar2 - 1) {
      fprintf(_stderr,",");
    }
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

static void print_pixel_type_list(const std::vector<int>& list)
{
    for (size_t i = 0; i < list.size(); i++)
    {
        const int type = list[i];
        if (type == -233)
            fprintf(stderr, "RAW");
        if (type == ncnn::Mat::PIXEL_RGB)
            fprintf(stderr, "RGB");
        if (type == ncnn::Mat::PIXEL_BGR)
            fprintf(stderr, "BGR");
        if (type == ncnn::Mat::PIXEL_GRAY)
            fprintf(stderr, "GRAY");
        if (type == ncnn::Mat::PIXEL_RGBA)
            fprintf(stderr, "RGBA");
        if (type == ncnn::Mat::PIXEL_BGRA)
            fprintf(stderr, "BGRA");
        if (i != list.size() - 1)
            fprintf(stderr, ",");
    }
}